

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  RTCRayQueryContext *pRVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  byte bVar17;
  int iVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  float *vertices;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong unaff_R12;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined4 uVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2614;
  Scene *local_2610;
  long local_2608;
  long local_2600;
  long local_25f8;
  long local_25f0;
  long local_25e8;
  long local_25e0;
  ulong local_25d8;
  ulong *local_25d0;
  long local_25c8;
  long local_25c0;
  RTCFilterFunctionNArguments local_25b8;
  float local_2588;
  undefined4 local_2584;
  undefined4 local_2580;
  float local_257c;
  float local_2578;
  undefined4 local_2574;
  uint local_2570;
  uint local_256c;
  uint local_2568;
  undefined8 local_2558;
  undefined8 uStack_2550;
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  byte local_2507;
  float local_24f8 [4];
  float local_24e8 [4];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
      local_25d0 = local_2368;
      auVar39 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar87 = ZEXT1664(auVar39);
      auVar40 = vmaxss_avx512f(auVar39,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar41 = vmaxss_avx512f(auVar39,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx512vl((undefined1  [16])aVar3,auVar42);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      uVar38 = vcmpps_avx512vl(auVar42,auVar45,1);
      bVar9 = (bool)((byte)uVar38 & 1);
      auVar58._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar3.x;
      bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar3.y;
      bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar3.z;
      bVar9 = (bool)((byte)(uVar38 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * aVar3.field_3.a;
      auVar42 = vrcp14ps_avx512vl(auVar58);
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = &DAT_3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar43 = vfnmadd213ps_avx512vl(auVar58,auVar42,auVar43);
      vfmadd132ps_fma(auVar43,auVar42,auVar42);
      auVar43 = vucomiss_avx512f(auVar39);
      auVar61 = vbroadcastss_avx512vl(auVar43);
      auVar88 = ZEXT3264(auVar61);
      auVar42 = vmovshdup_avx(auVar43);
      auVar61 = vbroadcastsd_avx512vl(auVar42);
      auVar89 = ZEXT3264(auVar61);
      auVar63._8_4_ = 2;
      auVar63._0_8_ = 0x200000002;
      auVar63._12_4_ = 2;
      auVar63._16_4_ = 2;
      auVar63._20_4_ = 2;
      auVar63._24_4_ = 2;
      auVar63._28_4_ = 2;
      vshufpd_avx(auVar43,auVar43,1);
      auVar61 = vpermps_avx512vl(auVar63,ZEXT1632(auVar43));
      auVar90 = ZEXT3264(auVar61);
      fVar71 = auVar43._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar61 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar91 = ZEXT3264(auVar61);
      auVar75 = ZEXT1632(CONCAT412(auVar43._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar43._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar43._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar71))));
      auVar62 = vpermps_avx512vl(auVar61,auVar75);
      auVar61 = vpermps_avx2(auVar63,auVar75);
      vucomiss_avx512f(auVar39);
      vucomiss_avx512f(auVar39);
      uVar77 = auVar40._0_4_;
      local_23b8._4_4_ = uVar77;
      local_23b8._0_4_ = uVar77;
      local_23b8._8_4_ = uVar77;
      local_23b8._12_4_ = uVar77;
      local_23b8._16_4_ = uVar77;
      local_23b8._20_4_ = uVar77;
      local_23b8._24_4_ = uVar77;
      local_23b8._28_4_ = uVar77;
      auVar81 = ZEXT3264(local_23b8);
      uVar77 = auVar41._0_4_;
      auVar76 = ZEXT3264(CONCAT428(uVar77,CONCAT424(uVar77,CONCAT420(uVar77,CONCAT416(uVar77,
                                                  CONCAT412(uVar77,CONCAT48(uVar77,CONCAT44(uVar77,
                                                  uVar77))))))));
      local_23d8._0_8_ = CONCAT44(fVar71,fVar71) ^ 0x8000000080000000;
      local_23d8._8_4_ = -fVar71;
      local_23d8._12_4_ = -fVar71;
      local_23d8._16_4_ = -fVar71;
      local_23d8._20_4_ = -fVar71;
      local_23d8._24_4_ = -fVar71;
      local_23d8._28_4_ = -fVar71;
      auVar82 = ZEXT3264(local_23d8);
      local_23f8._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
      local_23f8._8_4_ = auVar62._8_4_ ^ 0x80000000;
      local_23f8._12_4_ = auVar62._12_4_ ^ 0x80000000;
      local_23f8._16_4_ = auVar62._16_4_ ^ 0x80000000;
      local_23f8._20_4_ = auVar62._20_4_ ^ 0x80000000;
      local_23f8._24_4_ = auVar62._24_4_ ^ 0x80000000;
      local_23f8._28_4_ = auVar62._28_4_ ^ 0x80000000;
      auVar83 = ZEXT3264(local_23f8);
      local_2418._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
      local_2418._8_4_ = auVar61._8_4_ ^ 0x80000000;
      local_2418._12_4_ = auVar61._12_4_ ^ 0x80000000;
      local_2418._16_4_ = auVar61._16_4_ ^ 0x80000000;
      local_2418._20_4_ = auVar61._20_4_ ^ 0x80000000;
      local_2418._24_4_ = auVar61._24_4_ ^ 0x80000000;
      local_2418._28_4_ = auVar61._28_4_ ^ 0x80000000;
      auVar84 = ZEXT3264(local_2418);
      auVar61 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar85 = ZEXT3264(auVar61);
      auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      local_25e0 = 0;
      local_25e8 = 0x40;
      local_25f0 = 0x80;
      local_25f8 = 0x20;
      local_2600 = 0x60;
      local_2608 = 0xa0;
      lVar21 = 0x60;
      lVar26 = 0;
      lVar33 = 0x40;
      lVar20 = 0x80;
      lVar31 = 0x20;
      lVar35 = 0xa0;
      do {
        do {
          do {
            if (local_25d0 == &local_2378) {
              return;
            }
            pfVar1 = (float *)(local_25d0 + -1);
            local_25d0 = local_25d0 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar1);
          uVar38 = *local_25d0;
          do {
            auVar75 = auVar84._0_32_;
            auVar62 = auVar83._0_32_;
            auVar61 = auVar82._0_32_;
            if ((uVar38 & 8) == 0) {
              uVar19 = uVar38 & 0xfffffffffffffff0;
              uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar67._4_4_ = uVar77;
              auVar67._0_4_ = uVar77;
              auVar67._8_4_ = uVar77;
              auVar67._12_4_ = uVar77;
              auVar67._16_4_ = uVar77;
              auVar67._20_4_ = uVar77;
              auVar67._24_4_ = uVar77;
              auVar67._28_4_ = uVar77;
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + lVar26),auVar67,
                                        *(undefined1 (*) [32])(uVar19 + 0x40 + lVar26));
              auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar88._0_32_,auVar61);
              auVar63 = vmaxps_avx(auVar81._0_32_,auVar63);
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + lVar33),auVar67,
                                        *(undefined1 (*) [32])(uVar19 + 0x40 + lVar33));
              auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + lVar20),auVar67,
                                        *(undefined1 (*) [32])(uVar19 + 0x40 + lVar20));
              auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar89._0_32_,auVar62);
              auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar90._0_32_,auVar75);
              auVar64 = vmaxps_avx(auVar64,auVar65);
              auVar63 = vmaxps_avx(auVar63,auVar64);
              in_ZMM15 = ZEXT3264(auVar63);
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + lVar31),auVar67,
                                        *(undefined1 (*) [32])(uVar19 + 0x40 + lVar31));
              auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + lVar21),auVar67,
                                        *(undefined1 (*) [32])(uVar19 + 0x40 + lVar21));
              auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar88._0_32_,auVar61);
              auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar89._0_32_,auVar62);
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + lVar35),auVar67,
                                        *(undefined1 (*) [32])(uVar19 + 0x40 + lVar35));
              auVar66 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar90._0_32_,auVar75);
              auVar64 = vminps_avx(auVar64,auVar66);
              auVar65 = vminps_avx(auVar76._0_32_,auVar65);
              auVar64 = vminps_avx(auVar65,auVar64);
              if (((uint)uVar38 & 7) == 6) {
                uVar15 = vcmpps_avx512vl(auVar63,auVar64,2);
                uVar12 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [32])(uVar19 + 0x1c0),0xd);
                uVar13 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
                bVar17 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13;
              }
              else {
                uVar15 = vcmpps_avx512vl(auVar63,auVar64,2);
                bVar17 = (byte)uVar15;
              }
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar17);
            }
            if ((uVar38 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar18 = 4;
              }
              else {
                auVar63 = *(undefined1 (*) [32])(uVar38 & 0xfffffffffffffff0);
                auVar64 = ((undefined1 (*) [32])(uVar38 & 0xfffffffffffffff0))[1];
                auVar70 = in_ZMM15._0_32_;
                auVar65 = vpternlogd_avx512vl(auVar85._0_32_,auVar70,auVar86._0_32_,0xf8);
                uVar38 = unaff_R12 & 0xffffffff;
                auVar67 = vpcompressd_avx512vl(auVar65);
                bVar9 = (bool)((byte)uVar38 & 1);
                auVar66._0_4_ = (uint)bVar9 * auVar67._0_4_ | (uint)!bVar9 * auVar65._0_4_;
                bVar9 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar9 * auVar67._4_4_ | (uint)!bVar9 * auVar65._4_4_;
                bVar9 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar9 * auVar67._8_4_ | (uint)!bVar9 * auVar65._8_4_;
                bVar9 = (bool)((byte)(uVar38 >> 3) & 1);
                auVar66._12_4_ = (uint)bVar9 * auVar67._12_4_ | (uint)!bVar9 * auVar65._12_4_;
                bVar9 = (bool)((byte)(uVar38 >> 4) & 1);
                auVar66._16_4_ = (uint)bVar9 * auVar67._16_4_ | (uint)!bVar9 * auVar65._16_4_;
                bVar9 = (bool)((byte)(uVar38 >> 5) & 1);
                auVar66._20_4_ = (uint)bVar9 * auVar67._20_4_ | (uint)!bVar9 * auVar65._20_4_;
                bVar9 = (bool)((byte)(uVar38 >> 6) & 1);
                auVar66._24_4_ = (uint)bVar9 * auVar67._24_4_ | (uint)!bVar9 * auVar65._24_4_;
                bVar9 = (bool)((byte)(uVar38 >> 7) & 1);
                auVar66._28_4_ = (uint)bVar9 * auVar67._28_4_ | (uint)!bVar9 * auVar65._28_4_;
                auVar65 = vpermt2q_avx512vl(auVar63,auVar66,auVar64);
                uVar38 = auVar65._0_8_;
                iVar18 = 0;
                uVar19 = unaff_R12 - 1 & unaff_R12;
                if (uVar19 != 0) {
                  auVar65 = vpshufd_avx2(auVar66,0x55);
                  vpermt2q_avx512vl(auVar63,auVar65,auVar64);
                  auVar67 = vpminsd_avx2(auVar66,auVar65);
                  auVar65 = vpmaxsd_avx2(auVar66,auVar65);
                  uVar19 = uVar19 - 1 & uVar19;
                  if (uVar19 == 0) {
                    auVar61 = vpermi2q_avx512vl(auVar67,auVar63,auVar64);
                    uVar38 = auVar61._0_8_;
                    auVar61 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
                    *local_25d0 = auVar61._0_8_;
                    auVar61 = vpermd_avx2(auVar65,auVar70);
                    *(int *)(local_25d0 + 1) = auVar61._0_4_;
                    local_25d0 = local_25d0 + 2;
                  }
                  else {
                    auVar11 = vpshufd_avx2(auVar66,0xaa);
                    vpermt2q_avx512vl(auVar63,auVar11,auVar64);
                    auVar10 = vpminsd_avx2(auVar67,auVar11);
                    auVar67 = vpmaxsd_avx2(auVar67,auVar11);
                    auVar11 = vpminsd_avx2(auVar65,auVar67);
                    auVar65 = vpmaxsd_avx2(auVar65,auVar67);
                    uVar19 = uVar19 - 1 & uVar19;
                    if (uVar19 == 0) {
                      auVar61 = vpermi2q_avx512vl(auVar10,auVar63,auVar64);
                      uVar38 = auVar61._0_8_;
                      auVar61 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
                      *local_25d0 = auVar61._0_8_;
                      auVar61 = vpermd_avx2(auVar65,auVar70);
                      *(int *)(local_25d0 + 1) = auVar61._0_4_;
                      auVar61 = vpermt2q_avx512vl(auVar63,auVar11,auVar64);
                      local_25d0[2] = auVar61._0_8_;
                      auVar61 = vpermd_avx2(auVar11,auVar70);
                      *(int *)(local_25d0 + 3) = auVar61._0_4_;
                      local_25d0 = local_25d0 + 4;
                    }
                    else {
                      auVar68 = vmovdqa64_avx512vl(auVar70);
                      auVar67 = vpshufd_avx2(auVar66,0xff);
                      vpermt2q_avx512vl(auVar63,auVar67,auVar64);
                      auVar70 = vpminsd_avx2(auVar10,auVar67);
                      auVar67 = vpmaxsd_avx2(auVar10,auVar67);
                      auVar10 = vpminsd_avx2(auVar11,auVar67);
                      auVar67 = vpmaxsd_avx2(auVar11,auVar67);
                      auVar11 = vpminsd_avx2(auVar65,auVar67);
                      auVar65 = vpmaxsd_avx2(auVar65,auVar67);
                      uVar19 = uVar19 - 1 & uVar19;
                      auVar42 = auVar87._0_16_;
                      if (uVar19 == 0) {
                        auVar66 = vpermi2q_avx512vl(auVar70,auVar63,auVar64);
                        uVar38 = auVar66._0_8_;
                        auVar66 = vpermt2q_avx512vl(auVar63,auVar65,auVar64);
                        *local_25d0 = auVar66._0_8_;
                        auVar66 = vmovdqa64_avx512vl(auVar68);
                        auVar65 = vpermd_avx512vl(auVar65,auVar68);
                        *(int *)(local_25d0 + 1) = auVar65._0_4_;
                        auVar65 = vpermt2q_avx512vl(auVar63,auVar11,auVar64);
                        local_25d0[2] = auVar65._0_8_;
                        auVar65 = vpermd_avx512vl(auVar11,auVar68);
                        *(int *)(local_25d0 + 3) = auVar65._0_4_;
                        auVar63 = vpermt2q_avx512vl(auVar63,auVar10,auVar64);
                        local_25d0[4] = auVar63._0_8_;
                        auVar63 = vpermd_avx512vl(auVar10,auVar68);
                        *(int *)(local_25d0 + 5) = auVar63._0_4_;
                        local_25d0 = local_25d0 + 6;
                        auVar42 = vxorps_avx512vl(auVar42,auVar42);
                      }
                      else {
                        auVar69 = valignd_avx512vl(auVar66,auVar66,3);
                        auVar66 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                        auVar67 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                       CONCAT48(0x80000000,
                                                                                0x8000000080000000))
                                                            ),auVar66,auVar70);
                        auVar66 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar67 = vpermt2d_avx512vl(auVar67,auVar66,auVar10);
                        auVar67 = vpermt2d_avx512vl(auVar67,auVar66,auVar11);
                        auVar66 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar65 = vpermt2d_avx512vl(auVar67,auVar66,auVar65);
                        auVar82 = ZEXT3264(auVar65);
                        uVar38 = uVar19;
                        do {
                          auVar66 = auVar82._0_32_;
                          auVar65 = vpermps_avx512vl(auVar91._0_32_,auVar69);
                          auVar69 = valignd_avx512vl(auVar69,auVar69,1);
                          vpermt2q_avx512vl(auVar63,auVar69,auVar64);
                          uVar38 = uVar38 - 1 & uVar38;
                          uVar15 = vpcmpd_avx512vl(auVar65,auVar66,5);
                          auVar65 = vpmaxsd_avx2(auVar65,auVar66);
                          bVar17 = (byte)uVar15 << 1;
                          auVar66 = valignd_avx512vl(auVar66,auVar66,7);
                          bVar9 = (bool)((byte)uVar15 & 1);
                          auVar70._4_4_ = (uint)bVar9 * auVar66._4_4_ | (uint)!bVar9 * auVar65._4_4_
                          ;
                          auVar70._0_4_ = auVar65._0_4_;
                          bVar9 = (bool)(bVar17 >> 2 & 1);
                          auVar70._8_4_ = (uint)bVar9 * auVar66._8_4_ | (uint)!bVar9 * auVar65._8_4_
                          ;
                          bVar9 = (bool)(bVar17 >> 3 & 1);
                          auVar70._12_4_ =
                               (uint)bVar9 * auVar66._12_4_ | (uint)!bVar9 * auVar65._12_4_;
                          bVar9 = (bool)(bVar17 >> 4 & 1);
                          auVar70._16_4_ =
                               (uint)bVar9 * auVar66._16_4_ | (uint)!bVar9 * auVar65._16_4_;
                          bVar9 = (bool)(bVar17 >> 5 & 1);
                          auVar70._20_4_ =
                               (uint)bVar9 * auVar66._20_4_ | (uint)!bVar9 * auVar65._20_4_;
                          bVar9 = (bool)(bVar17 >> 6 & 1);
                          auVar70._24_4_ =
                               (uint)bVar9 * auVar66._24_4_ | (uint)!bVar9 * auVar65._24_4_;
                          auVar70._28_4_ =
                               (uint)(bVar17 >> 7) * auVar66._28_4_ |
                               (uint)!(bool)(bVar17 >> 7) * auVar65._28_4_;
                          auVar82 = ZEXT3264(auVar70);
                        } while (uVar38 != 0);
                        lVar24 = POPCOUNT(uVar19) + 3;
                        do {
                          auVar65 = vpermi2q_avx512vl(auVar70,auVar63,auVar64);
                          *local_25d0 = auVar65._0_8_;
                          auVar66 = auVar82._0_32_;
                          auVar65 = vpermd_avx512vl(auVar66,auVar68);
                          *(int *)(local_25d0 + 1) = auVar65._0_4_;
                          auVar70 = valignd_avx512vl(auVar66,auVar66,1);
                          local_25d0 = local_25d0 + 2;
                          auVar82 = ZEXT3264(auVar70);
                          lVar24 = lVar24 + -1;
                        } while (lVar24 != 0);
                        auVar63 = vpermt2q_avx512vl(auVar63,auVar70,auVar64);
                        uVar38 = auVar63._0_8_;
                        auVar42 = vxorps_avx512vl(auVar42,auVar42);
                        auVar66 = vmovdqa64_avx512vl(auVar68);
                      }
                      auVar87 = ZEXT1664(auVar42);
                      in_ZMM15 = ZEXT3264(auVar66);
                      auVar86 = ZEXT3264(auVar86._0_32_);
                      auVar85 = ZEXT3264(auVar85._0_32_);
                      auVar84 = ZEXT3264(auVar75);
                      auVar83 = ZEXT3264(auVar62);
                      auVar82 = ZEXT3264(auVar61);
                      auVar81 = ZEXT3264(auVar81._0_32_);
                      iVar18 = 0;
                    }
                  }
                }
              }
            }
            else {
              iVar18 = 6;
            }
          } while (iVar18 == 0);
        } while (iVar18 != 6);
        local_25d8 = unaff_R12;
        local_2398 = in_ZMM15._0_32_;
        local_25c8 = (ulong)((uint)uVar38 & 0xf) - 8;
        if (local_25c8 != 0) {
          uVar38 = uVar38 & 0xfffffffffffffff0;
          local_2610 = context->scene;
          lVar21 = 0;
          do {
            local_25c0 = lVar21;
            lVar20 = lVar21 * 0x50;
            pGVar6 = (local_2610->geometries).items[*(uint *)(uVar38 + 0x30 + lVar20)].ptr;
            fVar71 = (pGVar6->time_range).lower;
            fVar71 = pGVar6->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar71) /
                     ((pGVar6->time_range).upper - fVar71));
            auVar42 = vroundss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),9);
            auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar44 = vmaxss_avx512f(auVar87._0_16_,auVar42);
            lVar33 = (long)(int)auVar44._0_4_ * 0x38;
            lVar26 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar33);
            auVar42 = *(undefined1 (*) [16])(lVar26 + (ulong)*(uint *)(uVar38 + lVar20) * 4);
            uVar25 = (ulong)*(uint *)(uVar38 + 0x10 + lVar20);
            auVar43 = *(undefined1 (*) [16])(lVar26 + uVar25 * 4);
            uVar22 = (ulong)*(uint *)(uVar38 + 0x20 + lVar20);
            auVar39 = *(undefined1 (*) [16])(lVar26 + uVar22 * 4);
            uVar27 = (ulong)*(uint *)(uVar38 + 4 + lVar20);
            auVar40 = *(undefined1 (*) [16])(lVar26 + uVar27 * 4);
            uVar28 = (ulong)*(uint *)(uVar38 + 0x14 + lVar20);
            auVar41 = *(undefined1 (*) [16])(lVar26 + uVar28 * 4);
            uVar29 = (ulong)*(uint *)(uVar38 + 0x24 + lVar20);
            auVar58 = *(undefined1 (*) [16])(lVar26 + uVar29 * 4);
            uVar30 = (ulong)*(uint *)(uVar38 + 8 + lVar20);
            auVar45 = *(undefined1 (*) [16])(lVar26 + uVar30 * 4);
            uVar32 = (ulong)*(uint *)(uVar38 + 0x18 + lVar20);
            auVar47 = *(undefined1 (*) [16])(lVar26 + uVar32 * 4);
            uVar19 = (ulong)*(uint *)(uVar38 + 0x28 + lVar20);
            auVar56 = *(undefined1 (*) [16])(lVar26 + uVar19 * 4);
            uVar37 = (ulong)*(uint *)(uVar38 + 0xc + lVar20);
            auVar57 = *(undefined1 (*) [16])(lVar26 + uVar37 * 4);
            uVar36 = (ulong)*(uint *)(uVar38 + 0x1c + lVar20);
            auVar55 = *(undefined1 (*) [16])(lVar26 + uVar36 * 4);
            lVar33 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar33);
            uVar34 = (ulong)*(uint *)(uVar38 + 0x2c + lVar20);
            auVar46 = *(undefined1 (*) [16])(lVar26 + uVar34 * 4);
            auVar48 = *(undefined1 (*) [16])(lVar33 + (ulong)*(uint *)(uVar38 + lVar20) * 4);
            auVar49 = *(undefined1 (*) [16])(lVar33 + uVar25 * 4);
            auVar52 = *(undefined1 (*) [16])(lVar33 + uVar22 * 4);
            auVar50 = *(undefined1 (*) [16])(lVar33 + uVar27 * 4);
            auVar51 = *(undefined1 (*) [16])(lVar33 + uVar28 * 4);
            auVar53 = *(undefined1 (*) [16])(lVar33 + uVar29 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar33 + uVar30 * 4);
            auVar72 = *(undefined1 (*) [16])(lVar33 + uVar32 * 4);
            auVar4 = *(undefined1 (*) [16])(lVar33 + uVar19 * 4);
            auVar59 = *(undefined1 (*) [16])(lVar33 + uVar37 * 4);
            auVar73 = *(undefined1 (*) [16])(lVar33 + uVar36 * 4);
            auVar5 = *(undefined1 (*) [16])(lVar33 + uVar34 * 4);
            puVar2 = (undefined8 *)(uVar38 + 0x30 + lVar20);
            local_2488 = *puVar2;
            uStack_2480 = puVar2[1];
            puVar2 = (undefined8 *)(uVar38 + 0x40 + lVar20);
            auVar60 = vunpcklps_avx(auVar42,auVar45);
            auVar42 = vunpckhps_avx(auVar42,auVar45);
            auVar45 = vunpcklps_avx(auVar40,auVar57);
            auVar40 = vunpckhps_avx(auVar40,auVar57);
            auVar57 = vunpcklps_avx(auVar42,auVar40);
            auVar74 = vunpcklps_avx(auVar60,auVar45);
            auVar42 = vunpckhps_avx(auVar60,auVar45);
            auVar45 = vunpcklps_avx(auVar43,auVar47);
            auVar43 = vunpckhps_avx(auVar43,auVar47);
            auVar47 = vunpcklps_avx(auVar41,auVar55);
            auVar40 = vunpckhps_avx(auVar41,auVar55);
            auVar41 = vunpcklps_avx(auVar43,auVar40);
            auVar55 = vunpcklps_avx(auVar45,auVar47);
            auVar43 = vunpckhps_avx(auVar45,auVar47);
            auVar45 = vunpcklps_avx(auVar39,auVar56);
            auVar39 = vunpckhps_avx(auVar39,auVar56);
            auVar47 = vunpcklps_avx(auVar58,auVar46);
            auVar40 = vunpckhps_avx(auVar58,auVar46);
            auVar58 = vunpcklps_avx(auVar39,auVar40);
            auVar56 = vunpcklps_avx(auVar45,auVar47);
            auVar39 = vunpckhps_avx(auVar45,auVar47);
            auVar40 = vunpcklps_avx512vl(auVar48,auVar54);
            auVar45 = vunpckhps_avx512vl(auVar48,auVar54);
            auVar46 = vunpcklps_avx512vl(auVar50,auVar59);
            auVar47 = vunpckhps_avx512vl(auVar50,auVar59);
            auVar45 = vunpcklps_avx(auVar45,auVar47);
            auVar47 = vunpcklps_avx(auVar40,auVar46);
            auVar40 = vunpckhps_avx(auVar40,auVar46);
            auVar46 = vunpcklps_avx512vl(auVar49,auVar72);
            auVar48 = vunpckhps_avx512vl(auVar49,auVar72);
            auVar49 = vunpcklps_avx512vl(auVar51,auVar73);
            auVar50 = vunpckhps_avx512vl(auVar51,auVar73);
            auVar48 = vunpcklps_avx512vl(auVar48,auVar50);
            auVar50 = vunpcklps_avx512vl(auVar46,auVar49);
            auVar49 = vunpckhps_avx512vl(auVar46,auVar49);
            auVar51 = vunpcklps_avx512vl(auVar52,auVar4);
            auVar46 = vunpckhps_avx512vl(auVar52,auVar4);
            auVar52 = vunpcklps_avx512vl(auVar53,auVar5);
            auVar53 = vunpckhps_avx512vl(auVar53,auVar5);
            auVar46 = vunpcklps_avx(auVar46,auVar53);
            auVar53 = vunpcklps_avx512vl(auVar51,auVar52);
            auVar52 = vunpckhps_avx512vl(auVar51,auVar52);
            auVar54 = ZEXT416((uint)(fVar71 - auVar44._0_4_));
            auVar51 = vbroadcastss_avx512vl(auVar54);
            auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar54);
            auVar72._0_4_ = auVar54._0_4_;
            auVar72._4_4_ = auVar72._0_4_;
            auVar72._8_4_ = auVar72._0_4_;
            auVar72._12_4_ = auVar72._0_4_;
            auVar47 = vmulps_avx512vl(auVar51,auVar47);
            auVar40 = vmulps_avx512vl(auVar51,auVar40);
            auVar54 = vmulps_avx512vl(auVar51,auVar45);
            auVar45 = vfmadd231ps_fma(auVar47,auVar72,auVar74);
            auVar47 = vfmadd231ps_fma(auVar40,auVar72,auVar42);
            auVar57 = vfmadd231ps_fma(auVar54,auVar72,auVar57);
            auVar42 = vmulps_avx512vl(auVar51,auVar50);
            auVar40 = vmulps_avx512vl(auVar51,auVar49);
            auVar48 = vmulps_avx512vl(auVar51,auVar48);
            auVar42 = vfmadd231ps_fma(auVar42,auVar72,auVar55);
            auVar43 = vfmadd231ps_fma(auVar40,auVar72,auVar43);
            auVar40 = vfmadd231ps_fma(auVar48,auVar72,auVar41);
            auVar41 = vmulps_avx512vl(auVar51,auVar53);
            auVar55 = vmulps_avx512vl(auVar51,auVar52);
            auVar46 = vmulps_avx512vl(auVar51,auVar46);
            auVar41 = vfmadd231ps_fma(auVar41,auVar72,auVar56);
            auVar56 = vfmadd231ps_fma(auVar55,auVar72,auVar39);
            auVar58 = vfmadd231ps_fma(auVar46,auVar72,auVar58);
            local_2558 = *puVar2;
            uStack_2550 = puVar2[1];
            auVar42 = vsubps_avx(auVar45,auVar42);
            auVar43 = vsubps_avx(auVar47,auVar43);
            auVar39 = vsubps_avx(auVar57,auVar40);
            auVar40 = vsubps_avx(auVar41,auVar45);
            auVar41 = vsubps_avx(auVar56,auVar47);
            auVar58 = vsubps_avx(auVar58,auVar57);
            auVar46._0_4_ = auVar43._0_4_ * auVar58._0_4_;
            auVar46._4_4_ = auVar43._4_4_ * auVar58._4_4_;
            auVar46._8_4_ = auVar43._8_4_ * auVar58._8_4_;
            auVar46._12_4_ = auVar43._12_4_ * auVar58._12_4_;
            local_24c8 = vfmsub231ps_fma(auVar46,auVar41,auVar39);
            auVar48._0_4_ = auVar39._0_4_ * auVar40._0_4_;
            auVar48._4_4_ = auVar39._4_4_ * auVar40._4_4_;
            auVar48._8_4_ = auVar39._8_4_ * auVar40._8_4_;
            auVar48._12_4_ = auVar39._12_4_ * auVar40._12_4_;
            local_24b8 = vfmsub231ps_fma(auVar48,auVar58,auVar42);
            auVar49._0_4_ = auVar42._0_4_ * auVar41._0_4_;
            auVar49._4_4_ = auVar42._4_4_ * auVar41._4_4_;
            auVar49._8_4_ = auVar42._8_4_ * auVar41._8_4_;
            auVar49._12_4_ = auVar42._12_4_ * auVar41._12_4_;
            fVar71 = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar50._4_4_ = fVar71;
            auVar50._0_4_ = fVar71;
            auVar50._8_4_ = fVar71;
            auVar50._12_4_ = fVar71;
            auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]))
            ;
            auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar77 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar56._4_4_ = uVar77;
            auVar56._0_4_ = uVar77;
            auVar56._8_4_ = uVar77;
            auVar56._12_4_ = uVar77;
            auVar56 = vsubps_avx512vl(auVar45,auVar56);
            local_24a8 = vfmsub231ps_fma(auVar49,auVar40,auVar43);
            uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar55._4_4_ = uVar77;
            auVar55._0_4_ = uVar77;
            auVar55._8_4_ = uVar77;
            auVar55._12_4_ = uVar77;
            auVar55 = vsubps_avx512vl(auVar47,auVar55);
            uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar47._4_4_ = uVar77;
            auVar47._0_4_ = uVar77;
            auVar47._8_4_ = uVar77;
            auVar47._12_4_ = uVar77;
            auVar47 = vsubps_avx512vl(auVar57,auVar47);
            auVar45 = vmulps_avx512vl(auVar46,auVar47);
            auVar49 = vfmsub231ps_avx512vl(auVar45,auVar55,auVar48);
            auVar45 = vmulps_avx512vl(auVar48,auVar56);
            auVar45 = vfmsub231ps_fma(auVar45,auVar47,auVar50);
            auVar52._0_4_ = fVar71 * auVar55._0_4_;
            auVar52._4_4_ = fVar71 * auVar55._4_4_;
            auVar52._8_4_ = fVar71 * auVar55._8_4_;
            auVar52._12_4_ = fVar71 * auVar55._12_4_;
            auVar52 = vfmsub231ps_avx512vl(auVar52,auVar56,auVar46);
            auVar57 = vmulps_avx512vl(local_24a8,auVar48);
            auVar57 = vfmadd231ps_avx512vl(auVar57,local_24b8,auVar46);
            auVar46 = vfmadd231ps_avx512vl(auVar57,local_24c8,auVar50);
            auVar57._8_4_ = 0x7fffffff;
            auVar57._0_8_ = 0x7fffffff7fffffff;
            auVar57._12_4_ = 0x7fffffff;
            local_2518 = vandps_avx512vl(auVar46,auVar57);
            auVar58 = vmulps_avx512vl(auVar58,auVar52);
            auVar41 = vfmadd231ps_avx512vl(auVar58,auVar45,auVar41);
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar40);
            auVar40._8_4_ = 0x80000000;
            auVar40._0_8_ = 0x8000000080000000;
            auVar40._12_4_ = 0x80000000;
            auVar40 = vandpd_avx512vl(auVar46,auVar40);
            local_2548 = vxorps_avx512vl(auVar40,auVar41);
            auVar41._0_4_ = auVar39._0_4_ * auVar52._0_4_;
            auVar41._4_4_ = auVar39._4_4_ * auVar52._4_4_;
            auVar41._8_4_ = auVar39._8_4_ * auVar52._8_4_;
            auVar41._12_4_ = auVar39._12_4_ * auVar52._12_4_;
            auVar43 = vfmadd231ps_fma(auVar41,auVar43,auVar45);
            auVar42 = vfmadd231ps_fma(auVar43,auVar42,auVar49);
            local_2538._0_4_ = (float)(auVar40._0_4_ ^ auVar42._0_4_);
            local_2538._4_4_ = (float)(auVar40._4_4_ ^ auVar42._4_4_);
            local_2538._8_4_ = (float)(auVar40._8_4_ ^ auVar42._8_4_);
            local_2538._12_4_ = (float)(auVar40._12_4_ ^ auVar42._12_4_);
            auVar42 = ZEXT816(0) << 0x20;
            uVar15 = vcmpps_avx512vl(local_2548,auVar42,5);
            uVar12 = vcmpps_avx512vl(local_2538,auVar42,5);
            uVar13 = vcmpps_avx512vl(auVar46,auVar42,4);
            auVar39._0_4_ = local_2538._0_4_ + local_2548._0_4_;
            auVar39._4_4_ = local_2538._4_4_ + local_2548._4_4_;
            auVar39._8_4_ = local_2538._8_4_ + local_2548._8_4_;
            auVar39._12_4_ = local_2538._12_4_ + local_2548._12_4_;
            uVar14 = vcmpps_avx512vl(auVar39,local_2518,2);
            local_2507 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
            if (local_2507 != 0) {
              auVar54._0_4_ = local_24a8._0_4_ * auVar47._0_4_;
              auVar54._4_4_ = local_24a8._4_4_ * auVar47._4_4_;
              auVar54._8_4_ = local_24a8._8_4_ * auVar47._8_4_;
              auVar54._12_4_ = local_24a8._12_4_ * auVar47._12_4_;
              auVar42 = vfmadd213ps_fma(auVar55,local_24b8,auVar54);
              auVar42 = vfmadd213ps_fma(auVar56,local_24c8,auVar42);
              local_2528._0_4_ = (float)(auVar40._0_4_ ^ auVar42._0_4_);
              local_2528._4_4_ = (float)(auVar40._4_4_ ^ auVar42._4_4_);
              local_2528._8_4_ = (float)(auVar40._8_4_ ^ auVar42._8_4_);
              local_2528._12_4_ = (float)(auVar40._12_4_ ^ auVar42._12_4_);
              uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar51._4_4_ = uVar77;
              auVar51._0_4_ = uVar77;
              auVar51._8_4_ = uVar77;
              auVar51._12_4_ = uVar77;
              auVar42 = vmulps_avx512vl(local_2518,auVar51);
              fVar71 = (ray->super_RayK<1>).tfar;
              auVar53._4_4_ = fVar71;
              auVar53._0_4_ = fVar71;
              auVar53._8_4_ = fVar71;
              auVar53._12_4_ = fVar71;
              auVar43 = vmulps_avx512vl(local_2518,auVar53);
              uVar15 = vcmpps_avx512vl(local_2528,auVar43,2);
              uVar12 = vcmpps_avx512vl(auVar42,local_2528,1);
              local_2507 = (byte)uVar15 & (byte)uVar12 & local_2507;
              uVar19 = (ulong)local_2507;
              if (local_2507 != 0) {
                auVar42 = vrcp14ps_avx512vl(local_2518);
                auVar4._8_4_ = 0x3f800000;
                auVar4._0_8_ = &DAT_3f8000003f800000;
                auVar4._12_4_ = 0x3f800000;
                auVar43 = vfnmadd213ps_avx512vl(local_2518,auVar42,auVar4);
                auVar42 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
                fVar71 = auVar42._0_4_;
                local_24d8._0_4_ = fVar71 * local_2528._0_4_;
                fVar78 = auVar42._4_4_;
                local_24d8._4_4_ = fVar78 * local_2528._4_4_;
                fVar79 = auVar42._8_4_;
                local_24d8._8_4_ = fVar79 * local_2528._8_4_;
                fVar80 = auVar42._12_4_;
                local_24d8._12_4_ = fVar80 * local_2528._12_4_;
                auVar76 = ZEXT1664(local_24d8);
                local_24f8[0] = fVar71 * local_2548._0_4_;
                local_24f8[1] = fVar78 * local_2548._4_4_;
                local_24f8[2] = fVar79 * local_2548._8_4_;
                local_24f8[3] = fVar80 * local_2548._12_4_;
                local_24e8[0] = fVar71 * local_2538._0_4_;
                local_24e8[1] = fVar78 * local_2538._4_4_;
                local_24e8[2] = fVar79 * local_2538._8_4_;
                local_24e8[3] = fVar80 * local_2538._12_4_;
                auVar73._8_4_ = 0x7f800000;
                auVar73._0_8_ = 0x7f8000007f800000;
                auVar73._12_4_ = 0x7f800000;
                auVar42 = vblendmps_avx512vl(auVar73,local_24d8);
                auVar59._0_4_ =
                     (uint)(local_2507 & 1) * auVar42._0_4_ |
                     (uint)!(bool)(local_2507 & 1) * 0x7f800000;
                bVar9 = (bool)(local_2507 >> 1 & 1);
                auVar59._4_4_ = (uint)bVar9 * auVar42._4_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(local_2507 >> 2 & 1);
                auVar59._8_4_ = (uint)bVar9 * auVar42._8_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(local_2507 >> 3 & 1);
                auVar59._12_4_ = (uint)bVar9 * auVar42._12_4_ | (uint)!bVar9 * 0x7f800000;
                auVar42 = vshufps_avx(auVar59,auVar59,0xb1);
                auVar42 = vminps_avx(auVar42,auVar59);
                auVar43 = vshufpd_avx(auVar42,auVar42,1);
                auVar42 = vminps_avx(auVar43,auVar42);
                uVar15 = vcmpps_avx512vl(auVar59,auVar42,0);
                bVar17 = (byte)uVar15 & local_2507;
                if (((byte)uVar15 & local_2507) == 0) {
                  bVar17 = local_2507;
                }
                uVar25 = 0;
                for (uVar22 = (ulong)bVar17; (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  uVar25 = uVar25 + 1;
                }
                do {
                  auVar42 = auVar87._0_16_;
                  uVar23 = *(uint *)((long)&local_2488 + uVar25 * 4);
                  pGVar6 = (local_2610->geometries).items[uVar23].ptr;
                  if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar19 = (ulong)(byte)(~(byte)(1 << ((uint)uVar25 & 0x1f)) & (byte)uVar19);
                    bVar9 = true;
                  }
                  else {
                    pRVar7 = context->args;
                    if ((pRVar7->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar9 = false;
                    }
                    else {
                      local_2498 = auVar76._0_16_;
                      local_2478 = auVar90._0_32_;
                      local_2458 = auVar89._0_32_;
                      local_2438 = auVar88._0_32_;
                      local_25b8.context = context->user;
                      local_2588 = *(float *)(local_24c8 + uVar25 * 4);
                      local_2584 = *(undefined4 *)(local_24b8 + uVar25 * 4);
                      local_2580 = *(undefined4 *)(local_24a8 + uVar25 * 4);
                      local_257c = local_24f8[uVar25];
                      local_2578 = local_24e8[uVar25];
                      local_2574 = *(undefined4 *)((long)&local_2558 + uVar25 * 4);
                      local_2570 = uVar23;
                      local_256c = (local_25b8.context)->instID[0];
                      local_2568 = (local_25b8.context)->instPrimID[0];
                      fVar71 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_24d8 + uVar25 * 4);
                      local_2614 = -1;
                      local_25b8.valid = &local_2614;
                      local_25b8.geometryUserPtr = pGVar6->userPtr;
                      local_25b8.ray = (RTCRayN *)ray;
                      local_25b8.hit = (RTCHitN *)&local_2588;
                      local_25b8.N = 1;
                      if ((pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar6->intersectionFilterN)(&local_25b8), *local_25b8.valid != 0)) {
                        if (pRVar7->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar7->filter)(&local_25b8);
                          }
                          if (*local_25b8.valid == 0) goto LAB_01fc2464;
                        }
                        (((Vec3f *)((long)local_25b8.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_25b8.hit;
                        (((Vec3f *)((long)local_25b8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_25b8.hit + 4);
                        (((Vec3f *)((long)local_25b8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_25b8.hit + 8);
                        *(float *)((long)local_25b8.ray + 0x3c) = *(float *)(local_25b8.hit + 0xc);
                        *(float *)((long)local_25b8.ray + 0x40) = *(float *)(local_25b8.hit + 0x10);
                        *(float *)((long)local_25b8.ray + 0x44) = *(float *)(local_25b8.hit + 0x14);
                        *(float *)((long)local_25b8.ray + 0x48) = *(float *)(local_25b8.hit + 0x18);
                        *(float *)((long)local_25b8.ray + 0x4c) = *(float *)(local_25b8.hit + 0x1c);
                        *(float *)((long)local_25b8.ray + 0x50) = *(float *)(local_25b8.hit + 0x20);
                      }
                      else {
LAB_01fc2464:
                        (ray->super_RayK<1>).tfar = fVar71;
                      }
                      auVar76 = ZEXT1664(local_2498);
                      fVar71 = (ray->super_RayK<1>).tfar;
                      auVar5._4_4_ = fVar71;
                      auVar5._0_4_ = fVar71;
                      auVar5._8_4_ = fVar71;
                      auVar5._12_4_ = fVar71;
                      uVar15 = vcmpps_avx512vl(local_2498,auVar5,2);
                      uVar19 = (ulong)(byte)(~(byte)(1 << ((uint)uVar25 & 0x1f)) & (byte)uVar19 &
                                            (byte)uVar15);
                      bVar9 = true;
                      auVar42 = vxorps_avx512vl(auVar42,auVar42);
                      auVar87 = ZEXT1664(auVar42);
                      auVar88 = ZEXT3264(local_2438);
                      auVar89 = ZEXT3264(local_2458);
                      auVar90 = ZEXT3264(local_2478);
                      auVar61 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar91 = ZEXT3264(auVar61);
                    }
                  }
                  if (!bVar9) {
                    fVar71 = local_24f8[uVar25];
                    fVar78 = local_24e8[uVar25];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24d8 + uVar25 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24c8 + uVar25 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_24b8 + uVar25 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_24a8 + uVar25 * 4);
                    ray->u = fVar71;
                    ray->v = fVar78;
                    ray->primID = *(uint *)((long)&local_2558 + uVar25 * 4);
                    ray->geomID = uVar23;
                    pRVar8 = context->user;
                    ray->instID[0] = pRVar8->instID[0];
                    ray->instPrimID[0] = pRVar8->instPrimID[0];
                    break;
                  }
                  bVar17 = (byte)uVar19;
                  if (bVar17 == 0) break;
                  auVar74._8_4_ = 0x7f800000;
                  auVar74._0_8_ = 0x7f8000007f800000;
                  auVar74._12_4_ = 0x7f800000;
                  auVar42 = vblendmps_avx512vl(auVar74,auVar76._0_16_);
                  auVar60._0_4_ =
                       (uint)(bVar17 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar17 & 1) * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
                  auVar60._4_4_ = (uint)bVar9 * auVar42._4_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
                  auVar60._8_4_ = (uint)bVar9 * auVar42._8_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
                  auVar60._12_4_ = (uint)bVar9 * auVar42._12_4_ | (uint)!bVar9 * 0x7f800000;
                  auVar42 = vshufps_avx(auVar60,auVar60,0xb1);
                  auVar42 = vminps_avx(auVar42,auVar60);
                  auVar43 = vshufpd_avx(auVar42,auVar42,1);
                  auVar42 = vminps_avx(auVar43,auVar42);
                  uVar15 = vcmpps_avx512vl(auVar60,auVar42,0);
                  bVar17 = (byte)uVar15 & bVar17;
                  uVar23 = (uint)uVar19;
                  if (bVar17 != 0) {
                    uVar23 = (uint)bVar17;
                  }
                  uVar16 = 0;
                  for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x80000000) {
                    uVar16 = uVar16 + 1;
                  }
                  uVar25 = (ulong)uVar16;
                } while( true );
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != local_25c8);
        }
        fVar71 = (ray->super_RayK<1>).tfar;
        auVar76 = ZEXT3264(CONCAT428(fVar71,CONCAT424(fVar71,CONCAT420(fVar71,CONCAT416(fVar71,
                                                  CONCAT412(fVar71,CONCAT48(fVar71,CONCAT44(fVar71,
                                                  fVar71))))))));
        auVar81 = ZEXT3264(local_23b8);
        auVar82 = ZEXT3264(local_23d8);
        auVar83 = ZEXT3264(local_23f8);
        auVar84 = ZEXT3264(local_2418);
        auVar61 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar85 = ZEXT3264(auVar61);
        auVar86 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        in_ZMM15 = ZEXT3264(local_2398);
        lVar21 = local_2600;
        lVar26 = local_25e0;
        lVar33 = local_25e8;
        lVar20 = local_25f0;
        lVar31 = local_25f8;
        unaff_R12 = local_25d8;
        lVar35 = local_2608;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }